

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Var_Decl(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this,bool t_class_context,string *t_class_name)

{
  size_type sVar1;
  byte bVar2;
  bool bVar3;
  eval_error *peVar4;
  element_type *peVar5;
  string_view t_match;
  bool local_321;
  bool local_2b9;
  bool local_29a;
  allocator<char> local_299;
  string local_298;
  undefined1 local_275;
  File_Position local_274;
  allocator<char> local_269;
  string local_268;
  undefined1 local_245;
  File_Position local_244;
  allocator<char> local_239;
  string local_238;
  Static_String local_218;
  undefined1 local_205;
  File_Position local_204;
  allocator<char> local_1f9;
  string local_1f8;
  Static_String local_1d8;
  allocator<char> local_1c1;
  string local_1c0;
  undefined1 local_19d;
  File_Position local_19c;
  allocator<char> local_191;
  string local_190;
  Static_String local_170;
  undefined1 local_15d;
  File_Position local_15c;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  Static_String local_108;
  Static_String local_f8;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_bd;
  File_Position local_bc;
  allocator<char> local_b1;
  string local_b0;
  __sv_type local_90;
  value_type local_80;
  Static_String local_78;
  Static_String local_68 [2];
  Static_String local_48;
  size_type local_38;
  size_type prev_stack_top;
  bool retval;
  Depth_Counter dc;
  string *t_class_name_local;
  bool t_class_context_local;
  ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser = (ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
               *)t_class_name;
  Depth_Counter::Depth_Counter((Depth_Counter *)&stack0xffffffffffffffd8,this);
  prev_stack_top._7_1_ = 0;
  local_38 = Catch::clara::std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
             ::size(&this->m_match_stack);
  local_29a = false;
  if (t_class_context) {
    utility::Static_String::Static_String<5ul>(&local_48,(char (*) [5])0xb773d5);
    bVar3 = Keyword(this,&local_48);
    local_2b9 = true;
    if (!bVar3) {
      utility::Static_String::Static_String<5ul>(local_68,(char (*) [5])"auto");
      bVar3 = Keyword(this,local_68);
      local_2b9 = true;
      if (!bVar3) {
        utility::Static_String::Static_String<4ul>(&local_78,(char (*) [4])"var");
        local_2b9 = Keyword(this,&local_78);
      }
    }
    local_29a = local_2b9;
  }
  if (local_29a == false) {
    utility::Static_String::Static_String<5ul>(&local_f8,(char (*) [5])"auto");
    bVar3 = Keyword(this,&local_f8);
    local_321 = true;
    if (!bVar3) {
      utility::Static_String::Static_String<4ul>(&local_108,(char (*) [4])"var");
      local_321 = Keyword(this,&local_108);
    }
    if (local_321 == false) {
      utility::Static_String::Static_String<7ul>(&local_170,(char (*) [7])0xb744ee);
      bVar3 = Keyword(this,&local_170);
      if (bVar3) {
        prev_stack_top._7_1_ = 1;
        bVar3 = Reference(this);
        if ((!bVar3) && (bVar3 = Id(this,true), !bVar3)) {
          local_19d = 1;
          peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190,"Incomplete global declaration",&local_191);
          File_Position::File_Position(&local_19c,(this->m_position).line,(this->m_position).col);
          peVar5 = Catch::clara::std::
                   __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m_filename);
          exception::eval_error::eval_error(peVar4,&local_190,&local_19c,peVar5);
          local_19d = 0;
          __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        sVar1 = local_38;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c1);
        ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
        ::
        build_match<chaiscript::eval::Global_Decl_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
                  ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                    *)this,sVar1,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      }
      else {
        utility::Static_String::Static_String<5ul>(&local_1d8,(char (*) [5])0xb773d5);
        bVar3 = Keyword(this,&local_1d8);
        if (bVar3) {
          prev_stack_top._7_1_ = 1;
          bVar3 = Id(this,true);
          if (!bVar3) {
            local_205 = 1;
            peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f8,"Incomplete attribute declaration",&local_1f9);
            File_Position::File_Position(&local_204,(this->m_position).line,(this->m_position).col);
            peVar5 = Catch::clara::std::
                     __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->m_filename);
            exception::eval_error::eval_error(peVar4,&local_1f8,&local_204,peVar5);
            local_205 = 0;
            __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          utility::Static_String::Static_String<3ul>(&local_218,(char (*) [3])"::");
          bVar3 = Symbol(this,&local_218,false);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            local_245 = 1;
            peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_238,"Incomplete attribute declaration",&local_239);
            File_Position::File_Position(&local_244,(this->m_position).line,(this->m_position).col);
            peVar5 = Catch::clara::std::
                     __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->m_filename);
            exception::eval_error::eval_error(peVar4,&local_238,&local_244,peVar5);
            local_245 = 0;
            __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          bVar3 = Id(this,true);
          sVar1 = local_38;
          if (!bVar3) {
            local_275 = 1;
            peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_268,"Missing attribute name in definition",&local_269);
            File_Position::File_Position(&local_274,(this->m_position).line,(this->m_position).col);
            peVar5 = Catch::clara::std::
                     __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->m_filename);
            exception::eval_error::eval_error(peVar4,&local_268,&local_274,peVar5);
            local_275 = 0;
            __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
          ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
          ::
          build_match<chaiscript::eval::Attr_Decl_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
                    ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                      *)this,sVar1,&local_298);
          std::__cxx11::string::~string((string *)&local_298);
          std::allocator<char>::~allocator((allocator<char> *)&local_299);
        }
      }
    }
    else {
      prev_stack_top._7_1_ = 1;
      bVar3 = Reference(this);
      if (!bVar3) {
        bVar3 = Id(this,true);
        sVar1 = local_38;
        if (!bVar3) {
          local_15d = 1;
          peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"Incomplete variable declaration",&local_151);
          File_Position::File_Position(&local_15c,(this->m_position).line,(this->m_position).col);
          peVar5 = Catch::clara::std::
                   __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m_filename);
          exception::eval_error::eval_error(peVar4,&local_150,&local_15c,peVar5);
          local_15d = 0;
          __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
        ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
        ::build_match<chaiscript::eval::Var_Decl_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
                  ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                    *)this,sVar1,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator((allocator<char> *)&local_129);
      }
    }
  }
  else {
    prev_stack_top._7_1_ = 1;
    local_90 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)dc.parser);
    t_match._M_str = (char *)local_90._M_len;
    t_match._M_len = (size_t)this;
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::make_node<chaiscript::eval::Id_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)&local_80,t_match,(int)local_90._M_str,(this->m_position).line);
    Catch::clara::std::
    vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
    ::push_back(&this->m_match_stack,&local_80);
    Catch::clara::std::
    unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
    ::~unique_ptr(&local_80);
    bVar3 = Id(this,true);
    sVar1 = local_38;
    if (!bVar3) {
      local_bd = 1;
      peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Incomplete attribute declaration",&local_b1);
      File_Position::File_Position(&local_bc,(this->m_position).line,(this->m_position).col);
      peVar5 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar4,&local_b0,&local_bc,peVar5);
      local_bd = 0;
      __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::build_match<chaiscript::eval::Attr_Decl_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,sVar1,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  bVar2 = prev_stack_top._7_1_;
  Depth_Counter::~Depth_Counter((Depth_Counter *)&stack0xffffffffffffffd8);
  return (bool)(bVar2 & 1);
}

Assistant:

bool Var_Decl(const bool t_class_context = false, const std::string &t_class_name = "") {
        Depth_Counter dc{this};
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (t_class_context && (Keyword("attr") || Keyword("auto") || Keyword("var"))) {
          retval = true;

          m_match_stack.push_back(make_node<eval::Id_AST_Node<Tracer>>(t_class_name, m_position.line, m_position.col));

          if (!Id(true)) {
            throw exception::eval_error("Incomplete attribute declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Attr_Decl_AST_Node<Tracer>>(prev_stack_top);
        } else if (Keyword("auto") || Keyword("var")) {
          retval = true;

          if (Reference()) {
            // we built a reference node - continue
          } else if (Id(true)) {
            build_match<eval::Var_Decl_AST_Node<Tracer>>(prev_stack_top);
          } else {
            throw exception::eval_error("Incomplete variable declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }

        } else if (Keyword("global")) {
          retval = true;

          if (!(Reference() || Id(true))) {
            throw exception::eval_error("Incomplete global declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Global_Decl_AST_Node<Tracer>>(prev_stack_top);
        } else if (Keyword("attr")) {
          retval = true;

          if (!Id(true)) {
            throw exception::eval_error("Incomplete attribute declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }
          if (!Symbol("::")) {
            throw exception::eval_error("Incomplete attribute declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }
          if (!Id(true)) {
            throw exception::eval_error("Missing attribute name in definition", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Attr_Decl_AST_Node<Tracer>>(prev_stack_top);
        }

        return retval;
      }